

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O2

void __thiscall
Fl_Menu_Item::draw(Fl_Menu_Item *this,int x,int y,int w,int h,Fl_Menu_ *m,int selected)

{
  Fl_Color FVar1;
  int iVar2;
  Fl_Boxtype FVar3;
  uint uVar4;
  int iVar5;
  Fl_Color FVar6;
  _func_int **pp_Var7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  Fl_Color fg;
  uint uVar14;
  int iVar15;
  Fl_Label local_60;
  
  local_60.value = this->text;
  local_60.image = (Fl_Image *)0x0;
  local_60.deimage = (Fl_Image *)0x0;
  local_60.type = this->labeltype_;
  local_60.font = this->labelfont_;
  local_60.size = this->labelsize_;
  if (local_60.size == 0 && local_60.font == 0) {
    if (m == (Fl_Menu_ *)0x0) {
      local_60.font = 0;
    }
    else {
      local_60.font = m->textfont_;
    }
LAB_001ae284:
    local_60.size = FL_NORMAL_SIZE;
    if (m != (Fl_Menu_ *)0x0) {
      local_60.size = m->textsize_;
    }
  }
  else if (local_60.size == 0) goto LAB_001ae284;
  local_60.color = this->labelcolor_;
  if (local_60.color == 0) {
    if (m == (Fl_Menu_ *)0x0) {
      local_60.color = 0;
    }
    else {
      local_60.color = m->textcolor_;
    }
  }
  if ((this->flags & 1) != 0) {
    local_60.color = fl_inactive(local_60.color);
  }
  if (m == (Fl_Menu_ *)0x0) {
    if (selected != 0) {
      FVar3 = FL_FLAT_BOX;
      FVar6 = 0x31;
      fg = 0xf;
      goto LAB_001ae311;
    }
  }
  else if (selected != 0) {
    FVar6 = (m->super_Fl_Widget).color_;
    fg = (m->super_Fl_Widget).color2_;
    FVar3 = (Fl_Boxtype)(byte)(m->down_box_ + (m->down_box_ == '\0'));
LAB_001ae311:
    FVar1 = fl_contrast(fg,FVar6);
    if (FVar1 == fg) {
LAB_001ae339:
      FVar6 = fg;
      local_60.color = fl_contrast(this->labelcolor_,FVar6);
      if (selected != 2) {
        fl_draw_box(FVar3,x + 1,y + -1,w + -2,h + 2,FVar6);
        goto LAB_001ae3a8;
      }
    }
    else {
      if (selected != 2) {
        fg = 0x37;
        goto LAB_001ae339;
      }
      if (m == (Fl_Menu_ *)0x0) {
        FVar3 = FL_UP_BOX;
      }
      else {
        FVar3 = (Fl_Boxtype)(m->super_Fl_Widget).box_;
      }
    }
    fl_draw_box(FVar3,x,y,w,h,FVar6);
    x = x + 3;
    w = w + -8;
  }
LAB_001ae3a8:
  if ((this->flags & 10U) == 0) goto LAB_001ae788;
  iVar11 = ((h - FL_NORMAL_SIZE) + 1) / 2;
  iVar10 = h + iVar11 * -2;
  if ((this->flags & 8U) == 0) {
    fl_draw_box(FL_DOWN_BOX,x + 2,y + iVar11,iVar10,iVar10,7);
    if ((this->flags & 4) != 0) {
      iVar2 = Fl::is_scheme("gtk+");
      if (iVar2 == 0) {
        uVar8 = (ulong)this->labelcolor_;
      }
      else {
        uVar8 = 0xf;
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,uVar8);
      iVar5 = (iVar10 + -6) / 3;
      iVar2 = (((iVar10 + -6) - iVar5) + iVar10) / 2;
      uVar14 = iVar5 + 5 + x;
      for (iVar15 = 0; iVar15 != 3; iVar15 = iVar15 + 1) {
        uVar4 = y + iVar11 + iVar2 + -2 + iVar15;
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                  (fl_graphics_driver,x + 5,
                   (ulong)(uint)(((y + iVar11) - iVar5) + iVar2 + -2 + iVar15),(ulong)uVar14,
                   (ulong)uVar4);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                  (fl_graphics_driver,(ulong)uVar14,(ulong)uVar4,(ulong)((x + iVar10) - 2),
                   (ulong)(uint)(iVar15 + ((iVar11 * 3 + iVar5 + y + iVar2) - h) + 5));
      }
    }
  }
  else {
    FVar3 = fl_define_FL_ROUND_UP_BOX();
    iVar2 = x + 2;
    iVar11 = iVar11 + y;
    fl_draw_box(FVar3 + FL_FLAT_BOX,iVar2,iVar11,iVar10,iVar10,7);
    if ((this->flags & 4) != 0) {
      FVar3 = fl_define_FL_ROUND_UP_BOX();
      iVar5 = Fl::box_dw(FVar3 + FL_FLAT_BOX);
      iVar5 = (iVar10 - iVar5) / 2;
      uVar4 = iVar5 + 1;
      uVar14 = iVar5 + 2;
      if ((h - uVar4 & 1) == 0) {
        uVar14 = uVar4;
      }
      iVar5 = (int)(iVar10 - uVar14) / 2;
      iVar15 = Fl::is_scheme("gtk+");
      if (iVar15 == 0) {
        uVar4 = this->labelcolor_;
      }
      else {
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0xf);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  (0,0x4076800000000000,fl_graphics_driver,(ulong)(x + iVar5 + 1),
                   (ulong)(uint)(iVar11 + -1 + iVar5),(ulong)(uVar14 + 2),(ulong)(uVar14 + 2));
        uVar4 = fl_color_average(0xff,0xf,0.2);
        uVar14 = uVar14 - 1;
      }
      uVar8 = (ulong)uVar14;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)uVar4);
      if (uVar14 - 3 < 3) {
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                  (fl_graphics_driver,(ulong)(x + iVar5 + 3),(ulong)(uint)(iVar5 + iVar11),
                   (ulong)(uVar14 - 2),uVar8);
        uVar12 = (ulong)(x + iVar5 + 2);
        uVar9 = (ulong)(uint)(iVar5 + 1 + iVar11);
        pp_Var7 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
        uVar13 = (ulong)(uVar14 - 2);
LAB_001ae703:
        (*pp_Var7[4])(fl_graphics_driver,uVar12,uVar9,uVar8,uVar13);
      }
      else {
        if (uVar14 - 1 < 2) {
          uVar12 = (ulong)(uint)(iVar2 + iVar5);
          uVar9 = (ulong)(uint)(iVar5 + iVar11);
          pp_Var7 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
          uVar13 = uVar8;
          goto LAB_001ae703;
        }
        if (uVar14 == 6) {
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                    (fl_graphics_driver,(ulong)(x + iVar5 + 4),(ulong)(uint)(iVar5 + iVar11),2,6);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                    (fl_graphics_driver,(ulong)(x + iVar5 + 3),(ulong)(uint)(iVar5 + 1 + iVar11),4,4
                    );
          uVar12 = (ulong)(x + iVar5 + 2);
          uVar9 = (ulong)(uint)(iVar5 + 2 + iVar11);
          pp_Var7 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
          uVar8 = 6;
          uVar13 = 2;
          goto LAB_001ae703;
        }
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  (0,0x4076800000000000,fl_graphics_driver,(ulong)(uint)(iVar2 + iVar5),
                   (ulong)(uint)(iVar5 + iVar11),uVar8,uVar8);
      }
      iVar15 = Fl::is_scheme("gtk+");
      if (iVar15 != 0) {
        FVar6 = fl_color_average(0xff,0xf,0.5);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar6);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
                  (0,0x4066800000000000,fl_graphics_driver,(ulong)(uint)(iVar2 + iVar5),
                   (ulong)(uint)(iVar11 + iVar5),(ulong)(uVar14 + 1),(ulong)(uVar14 + 1));
      }
    }
  }
  x = x + iVar10 + 3;
  w = w - (iVar10 + 3);
LAB_001ae788:
  if (fl_draw_shortcut == '\0') {
    fl_draw_shortcut = '\x01';
  }
  iVar10 = 0;
  if (6 < w) {
    iVar10 = w + -6;
  }
  Fl_Label::draw(&local_60,x + 3,y,iVar10,h,4);
  fl_draw_shortcut = '\0';
  return;
}

Assistant:

void Fl_Menu_Item::draw(int x, int y, int w, int h, const Fl_Menu_* m,
			int selected) const {
  Fl_Label l;
  l.value   = text;
  l.image   = 0;
  l.deimage = 0;
  l.type    = labeltype_;
  l.font    = labelsize_ || labelfont_ ? labelfont_ : (m ? m->textfont() : FL_HELVETICA);
  l.size    = labelsize_ ? labelsize_ : m ? m->textsize() : FL_NORMAL_SIZE;
  l.color   = labelcolor_ ? labelcolor_ : m ? m->textcolor() : int(FL_FOREGROUND_COLOR);
  if (!active()) l.color = fl_inactive((Fl_Color)l.color);
  Fl_Color color = m ? m->color() : FL_GRAY;
  if (selected) {
    Fl_Color r = m ? m->selection_color() : FL_SELECTION_COLOR;
    Fl_Boxtype b = m && m->down_box() ? m->down_box() : FL_FLAT_BOX;
    if (fl_contrast(r,color)!=r) { // back compatibility boxtypes
      if (selected == 2) { // menu title
	r = color;
	b = m ? m->box() : FL_UP_BOX;
      } else {
	r = (Fl_Color)(FL_COLOR_CUBE-1); // white
	l.color = fl_contrast((Fl_Color)labelcolor_, r);
      }
    } else {
      l.color = fl_contrast((Fl_Color)labelcolor_, r);
    }
    if (selected == 2) { // menu title
      fl_draw_box(b, x, y, w, h, r);
      x += 3;
      w -= 8;
    } else {
      fl_draw_box(b, x+1, y-(LEADING-2)/2, w-2, h+(LEADING-2), r);
    }
  }

  if (flags & (FL_MENU_TOGGLE|FL_MENU_RADIO)) {
    int d = (h - FL_NORMAL_SIZE + 1) / 2;
    int W = h - 2 * d;

    if (flags & FL_MENU_RADIO) {
      fl_draw_box(FL_ROUND_DOWN_BOX, x+2, y+d, W, W, FL_BACKGROUND2_COLOR);
      if (value()) {
	int tW = (W - Fl::box_dw(FL_ROUND_DOWN_BOX)) / 2 + 1;
	if ((W - tW) & 1) tW++;	// Make sure difference is even to center
	int td = (W - tW) / 2;
        if (Fl::is_scheme("gtk+")) {
	  fl_color(FL_SELECTION_COLOR);
	  tW --;
	  fl_pie(x + td + 1, y + d + td - 1, tW + 3, tW + 3, 0.0, 360.0);
	  fl_color(fl_color_average(FL_WHITE, FL_SELECTION_COLOR, 0.2f));
	} else fl_color(labelcolor_);

	switch (tW) {
	  // Larger circles draw fine...
	  default :
            fl_pie(x + td + 2, y + d + td, tW, tW, 0.0, 360.0);
	    break;

          // Small circles don't draw well on many systems...
	  case 6 :
	    fl_rectf(x + td + 4, y + d + td, tW - 4, tW);
	    fl_rectf(x + td + 3, y + d + td + 1, tW - 2, tW - 2);
	    fl_rectf(x + td + 2, y + d + td + 2, tW, tW - 4);
	    break;

	  case 5 :
	  case 4 :
	  case 3 :
	    fl_rectf(x + td + 3, y + d + td, tW - 2, tW);
	    fl_rectf(x + td + 2, y + d + td + 1, tW, tW - 2);
	    break;

	  case 2 :
	  case 1 :
	    fl_rectf(x + td + 2, y + d + td, tW, tW);
	    break;
	}

	if (Fl::is_scheme("gtk+")) {
	  fl_color(fl_color_average(FL_WHITE, FL_SELECTION_COLOR, 0.5));
	  fl_arc(x + td + 2, y + d + td, tW + 1, tW + 1, 60.0, 180.0);
	}
      }
    } else {
      fl_draw_box(FL_DOWN_BOX, x+2, y+d, W, W, FL_BACKGROUND2_COLOR);
      if (value()) {
	if (Fl::is_scheme("gtk+")) {
	  fl_color(FL_SELECTION_COLOR);
	} else {
	  fl_color(labelcolor_);
	}
	int tx = x + 5;
	int tw = W - 6;
	int d1 = tw/3;
	int d2 = tw-d1;
	int ty = y + d + (W+d2)/2-d1-2;
	for (int n = 0; n < 3; n++, ty++) {
	  fl_line(tx, ty, tx+d1, ty+d1);
	  fl_line(tx+d1, ty+d1, tx+tw-1, ty+d1-d2+1);
	}
      }
    }
    x += W + 3;
    w -= W + 3;
  }

  if (!fl_draw_shortcut) fl_draw_shortcut = 1;
  l.draw(x+3, y, w>6 ? w-6 : 0, h, FL_ALIGN_LEFT);
  fl_draw_shortcut = 0;
}